

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryop.cpp
# Opt level: O0

int ncnn::binary_op<ncnn::binary_op_rsub<float>>(Mat *a,Mat *b,Mat *c)

{
  bool bVar1;
  float *pfVar2;
  float *pfVar3;
  Mat *in_RDX;
  Mat *in_RSI;
  Mat *in_RDI;
  float fVar4;
  int i_10;
  int i_9;
  float b0_5;
  int x_3;
  float a0_5;
  int y_3;
  float *outptr_8;
  float *ptr1_5;
  int i_8;
  float *outptr_7;
  float *ptr1_4;
  float a0_4;
  int q_6;
  int i_7;
  float a0_3;
  int i_6;
  float a0_2;
  int i_5;
  float *outptr_6;
  float *ptr1_3;
  int q_5;
  float a0_1;
  int x_2;
  float b0_4;
  int y_2;
  float *outptr_5;
  float *ptr_5;
  int i_4;
  float b0_3;
  int i_3;
  int x_1;
  float a0;
  int y_1;
  float *outptr_4;
  float *ptr1_2;
  float *ptr_4;
  int q_4;
  int i_2;
  float *outptr_3;
  float b0_2;
  float *ptr_3;
  int q_3;
  int i_1;
  float *outptr_2;
  float *ptr_2;
  int q_2;
  float b0_1;
  int x;
  float b0;
  int y;
  float *outptr_1;
  float *ptr1_1;
  float *ptr_1;
  int q_1;
  int i;
  float *outptr;
  float *ptr1;
  float *ptr;
  int q;
  int size1;
  int channels1;
  int h1;
  int w1;
  int size;
  int channels;
  int h;
  int w;
  binary_op_rsub<float> op;
  Mat *in_stack_fffffffffffffaf0;
  int in_stack_fffffffffffffaf8;
  int in_stack_fffffffffffffafc;
  Mat *in_stack_fffffffffffffb00;
  int _c;
  int _h;
  undefined8 in_stack_fffffffffffffb08;
  int _w;
  undefined4 in_stack_fffffffffffffb10;
  undefined4 in_stack_fffffffffffffb14;
  int local_468;
  int local_464;
  float local_460;
  int local_45c;
  float local_458;
  int local_454;
  float *local_450;
  float *local_448;
  int local_43c;
  Mat local_438;
  float *local_408;
  Mat local_400;
  float *local_3d0;
  float local_3c4;
  int local_3c0;
  int local_3bc;
  float local_3b8;
  int local_3b4;
  float local_3b0;
  int local_3ac;
  Mat local_3a8;
  float *local_378;
  Mat local_370;
  float *local_340;
  int local_334;
  float local_330;
  int local_32c;
  float local_328;
  int local_324;
  float *local_320;
  float *local_318;
  int local_310;
  float local_30c;
  int local_308;
  int local_304;
  float local_300;
  int local_2fc;
  Mat local_2f8;
  float *local_2c8;
  Mat local_2c0;
  float *local_290;
  float *local_288;
  int local_280;
  int local_27c;
  Mat local_278;
  float *local_248;
  float local_23c;
  Mat local_238;
  float *local_208;
  int local_200;
  int local_1fc;
  Mat local_1f8;
  float *local_1c8;
  Mat local_1c0;
  float *local_190;
  int local_184;
  float local_180;
  int local_17c;
  float local_178;
  int local_174;
  Mat local_170;
  float *local_140;
  float *local_138;
  Mat local_130;
  float *local_100;
  int local_f8;
  int local_f4;
  Mat local_f0;
  float *local_c0;
  Mat local_b8;
  float *local_88;
  Mat local_80;
  float *local_50;
  int local_48;
  int local_44;
  int local_40;
  int local_3c;
  int local_38;
  int local_34;
  int local_30;
  int local_2c;
  int local_28;
  binary_op_rsub<float> local_21;
  Mat *local_20;
  Mat *local_18;
  Mat *local_10;
  
  local_28 = in_RDI->w;
  local_2c = in_RDI->h;
  local_30 = in_RDI->c;
  local_34 = local_28 * local_2c;
  local_38 = in_RSI->w;
  local_3c = in_RSI->h;
  local_40 = in_RSI->c;
  local_44 = local_38 * local_3c;
  _c = (int)((ulong)in_stack_fffffffffffffb00 >> 0x20);
  _h = (int)in_stack_fffffffffffffb08;
  _w = (int)((ulong)in_stack_fffffffffffffb08 >> 0x20);
  local_18 = in_RSI;
  if (in_RDI->dims == 3) {
    Mat::create((Mat *)CONCAT44(in_stack_fffffffffffffb14,in_stack_fffffffffffffb10),_w,_h,_c,
                CONCAT44(in_stack_fffffffffffffafc,in_stack_fffffffffffffaf8));
    bVar1 = Mat::empty(in_stack_fffffffffffffaf0);
    if (bVar1) {
      return -100;
    }
    if (local_18->dims == 3) {
      for (local_48 = 0; local_48 < local_30; local_48 = local_48 + 1) {
        Mat::channel((Mat *)CONCAT44(in_stack_fffffffffffffafc,in_stack_fffffffffffffaf8),
                     (int)((ulong)in_stack_fffffffffffffaf0 >> 0x20));
        pfVar2 = Mat::operator_cast_to_float_(&local_80);
        Mat::~Mat((Mat *)0x13a393);
        local_50 = pfVar2;
        Mat::channel((Mat *)CONCAT44(in_stack_fffffffffffffafc,in_stack_fffffffffffffaf8),
                     (int)((ulong)in_stack_fffffffffffffaf0 >> 0x20));
        pfVar2 = Mat::operator_cast_to_float_(&local_b8);
        Mat::~Mat((Mat *)0x13a3e1);
        local_88 = pfVar2;
        Mat::channel((Mat *)CONCAT44(in_stack_fffffffffffffafc,in_stack_fffffffffffffaf8),
                     (int)((ulong)in_stack_fffffffffffffaf0 >> 0x20));
        pfVar2 = Mat::operator_cast_to_float_(&local_f0);
        Mat::~Mat((Mat *)0x13a42f);
        local_c0 = pfVar2;
        for (local_f4 = 0; local_f4 < local_34; local_f4 = local_f4 + 1) {
          fVar4 = binary_op_rsub<float>::operator()
                            (&local_21,local_50 + local_f4,local_88 + local_f4);
          local_c0[local_f4] = fVar4;
        }
      }
      return 0;
    }
    if (local_18->dims == 2) {
      for (local_f8 = 0; local_f8 < local_30; local_f8 = local_f8 + 1) {
        Mat::channel((Mat *)CONCAT44(in_stack_fffffffffffffafc,in_stack_fffffffffffffaf8),
                     (int)((ulong)in_stack_fffffffffffffaf0 >> 0x20));
        pfVar2 = Mat::operator_cast_to_float_(&local_130);
        Mat::~Mat((Mat *)0x13a554);
        local_100 = pfVar2;
        local_138 = Mat::operator_cast_to_float_(local_18);
        local_138 = local_138 + local_2c * local_f8;
        Mat::channel((Mat *)CONCAT44(in_stack_fffffffffffffafc,in_stack_fffffffffffffaf8),
                     (int)((ulong)in_stack_fffffffffffffaf0 >> 0x20));
        pfVar2 = Mat::operator_cast_to_float_(&local_170);
        Mat::~Mat((Mat *)0x13a5d0);
        local_140 = pfVar2;
        for (local_174 = 0; local_174 < local_2c; local_174 = local_174 + 1) {
          local_178 = local_138[local_174];
          for (local_17c = 0; local_17c < local_28; local_17c = local_17c + 1) {
            fVar4 = binary_op_rsub<float>::operator()(&local_21,local_100 + local_17c,&local_178);
            local_140[local_17c] = fVar4;
          }
          local_100 = local_100 + local_28;
          local_140 = local_140 + local_28;
        }
      }
      return 0;
    }
    if (local_18->dims == 1) {
      if (local_18->w == 1) {
        pfVar2 = Mat::operator[](local_18,0);
        local_180 = *pfVar2;
        for (local_184 = 0; local_184 < local_30; local_184 = local_184 + 1) {
          Mat::channel((Mat *)CONCAT44(in_stack_fffffffffffffafc,in_stack_fffffffffffffaf8),
                       (int)((ulong)in_stack_fffffffffffffaf0 >> 0x20));
          pfVar2 = Mat::operator_cast_to_float_(&local_1c0);
          Mat::~Mat((Mat *)0x13a7a6);
          local_190 = pfVar2;
          Mat::channel((Mat *)CONCAT44(in_stack_fffffffffffffafc,in_stack_fffffffffffffaf8),
                       (int)((ulong)in_stack_fffffffffffffaf0 >> 0x20));
          pfVar2 = Mat::operator_cast_to_float_(&local_1f8);
          Mat::~Mat((Mat *)0x13a7f1);
          local_1c8 = pfVar2;
          for (local_1fc = 0; local_1fc < local_34; local_1fc = local_1fc + 1) {
            fVar4 = binary_op_rsub<float>::operator()(&local_21,local_190 + local_1fc,&local_180);
            local_1c8[local_1fc] = fVar4;
          }
        }
        return 0;
      }
      for (local_200 = 0; local_200 < local_30; local_200 = local_200 + 1) {
        Mat::channel((Mat *)CONCAT44(in_stack_fffffffffffffafc,in_stack_fffffffffffffaf8),
                     (int)((ulong)in_stack_fffffffffffffaf0 >> 0x20));
        pfVar2 = Mat::operator_cast_to_float_(&local_238);
        Mat::~Mat((Mat *)0x13a8f2);
        local_208 = pfVar2;
        pfVar2 = Mat::operator[](local_18,local_200);
        local_23c = *pfVar2;
        Mat::channel((Mat *)CONCAT44(in_stack_fffffffffffffafc,in_stack_fffffffffffffaf8),
                     (int)((ulong)in_stack_fffffffffffffaf0 >> 0x20));
        pfVar2 = Mat::operator_cast_to_float_(&local_278);
        Mat::~Mat((Mat *)0x13a95b);
        local_248 = pfVar2;
        for (local_27c = 0; local_27c < local_34; local_27c = local_27c + 1) {
          fVar4 = binary_op_rsub<float>::operator()(&local_21,local_208 + local_27c,&local_23c);
          local_248[local_27c] = fVar4;
        }
      }
      return 0;
    }
  }
  else {
    local_20 = in_RDX;
    local_10 = in_RDI;
    if (in_RDI->dims == 2) {
      if (in_RSI->dims == 3) {
        Mat::create((Mat *)CONCAT44(in_stack_fffffffffffffb14,in_stack_fffffffffffffb10),_w,_h,_c,
                    CONCAT44(in_stack_fffffffffffffafc,in_stack_fffffffffffffaf8));
        bVar1 = Mat::empty(in_stack_fffffffffffffaf0);
        if (!bVar1) {
          for (local_280 = 0; local_280 < local_40; local_280 = local_280 + 1) {
            local_288 = Mat::operator_cast_to_float_(local_10);
            local_288 = local_288 + local_3c * local_280;
            Mat::channel((Mat *)CONCAT44(in_stack_fffffffffffffafc,in_stack_fffffffffffffaf8),
                         (int)((ulong)in_stack_fffffffffffffaf0 >> 0x20));
            pfVar2 = Mat::operator_cast_to_float_(&local_2c0);
            Mat::~Mat((Mat *)0x13aafb);
            local_290 = pfVar2;
            Mat::channel((Mat *)CONCAT44(in_stack_fffffffffffffafc,in_stack_fffffffffffffaf8),
                         (int)((ulong)in_stack_fffffffffffffaf0 >> 0x20));
            pfVar2 = Mat::operator_cast_to_float_(&local_2f8);
            Mat::~Mat((Mat *)0x13ab43);
            local_2c8 = pfVar2;
            for (local_2fc = 0; local_2fc < local_3c; local_2fc = local_2fc + 1) {
              local_300 = local_288[local_2fc];
              for (local_304 = 0; local_304 < local_38; local_304 = local_304 + 1) {
                fVar4 = binary_op_rsub<float>::operator()
                                  (&local_21,&local_300,local_290 + local_304);
                local_2c8[local_304] = fVar4;
              }
              local_290 = local_290 + local_38;
              local_2c8 = local_2c8 + local_38;
            }
          }
          return 0;
        }
        return -100;
      }
      Mat::create(in_stack_fffffffffffffb00,in_stack_fffffffffffffafc,in_stack_fffffffffffffaf8,
                  (size_t)in_stack_fffffffffffffaf0);
      bVar1 = Mat::empty(in_stack_fffffffffffffaf0);
      if (bVar1) {
        return -100;
      }
      if (local_18->dims == 2) {
        for (local_308 = 0; local_308 < local_34; local_308 = local_308 + 1) {
          pfVar2 = Mat::operator[](local_10,local_308);
          pfVar3 = Mat::operator[](local_18,local_308);
          fVar4 = binary_op_rsub<float>::operator()(&local_21,pfVar2,pfVar3);
          pfVar2 = Mat::operator[](local_20,local_308);
          *pfVar2 = fVar4;
        }
        return 0;
      }
      if (local_18->dims == 1) {
        Mat::create(in_stack_fffffffffffffb00,in_stack_fffffffffffffafc,in_stack_fffffffffffffaf8,
                    (size_t)in_stack_fffffffffffffaf0);
        bVar1 = Mat::empty(in_stack_fffffffffffffaf0);
        if (bVar1) {
          return -100;
        }
        if (local_18->w == 1) {
          pfVar2 = Mat::operator[](local_18,0);
          local_30c = *pfVar2;
          for (local_310 = 0; local_310 < local_34; local_310 = local_310 + 1) {
            pfVar2 = Mat::operator[](local_10,local_310);
            fVar4 = binary_op_rsub<float>::operator()(&local_21,pfVar2,&local_30c);
            pfVar2 = Mat::operator[](local_20,local_310);
            *pfVar2 = fVar4;
          }
          return 0;
        }
        local_318 = Mat::operator_cast_to_float_(local_10);
        local_320 = Mat::operator_cast_to_float_(local_20);
        for (local_324 = 0; local_324 < local_2c; local_324 = local_324 + 1) {
          pfVar2 = Mat::operator[](local_18,local_324);
          local_328 = *pfVar2;
          for (local_32c = 0; local_32c < local_28; local_32c = local_32c + 1) {
            fVar4 = binary_op_rsub<float>::operator()(&local_21,local_318 + local_32c,&local_328);
            local_320[local_32c] = fVar4;
          }
          local_318 = local_318 + local_28;
          local_320 = local_320 + local_28;
        }
        return 0;
      }
    }
    else if (in_RDI->dims == 1) {
      if (in_RDI->w == 1) {
        if (in_RSI->dims == 3) {
          Mat::create((Mat *)CONCAT44(in_stack_fffffffffffffb14,in_stack_fffffffffffffb10),_w,_h,_c,
                      CONCAT44(in_stack_fffffffffffffafc,in_stack_fffffffffffffaf8));
          bVar1 = Mat::empty(in_stack_fffffffffffffaf0);
          if (!bVar1) {
            pfVar2 = Mat::operator[](local_10,0);
            local_330 = *pfVar2;
            for (local_334 = 0; local_334 < local_40; local_334 = local_334 + 1) {
              Mat::channel((Mat *)CONCAT44(in_stack_fffffffffffffafc,in_stack_fffffffffffffaf8),
                           (int)((ulong)in_stack_fffffffffffffaf0 >> 0x20));
              pfVar2 = Mat::operator_cast_to_float_(&local_370);
              Mat::~Mat((Mat *)0x13b0c6);
              local_340 = pfVar2;
              Mat::channel((Mat *)CONCAT44(in_stack_fffffffffffffafc,in_stack_fffffffffffffaf8),
                           (int)((ulong)in_stack_fffffffffffffaf0 >> 0x20));
              pfVar2 = Mat::operator_cast_to_float_(&local_3a8);
              Mat::~Mat((Mat *)0x13b10e);
              local_378 = pfVar2;
              for (local_3ac = 0; local_3ac < local_44; local_3ac = local_3ac + 1) {
                fVar4 = binary_op_rsub<float>::operator()
                                  (&local_21,&local_330,local_340 + local_3ac);
                local_378[local_3ac] = fVar4;
              }
            }
            return 0;
          }
          return -100;
        }
        if (in_RSI->dims == 2) {
          Mat::create(in_stack_fffffffffffffb00,in_stack_fffffffffffffafc,in_stack_fffffffffffffaf8,
                      (size_t)in_stack_fffffffffffffaf0);
          bVar1 = Mat::empty(in_stack_fffffffffffffaf0);
          if (!bVar1) {
            pfVar2 = Mat::operator[](local_10,0);
            local_3b0 = *pfVar2;
            for (local_3b4 = 0; local_3b4 < local_44; local_3b4 = local_3b4 + 1) {
              pfVar2 = Mat::operator[](local_18,local_3b4);
              fVar4 = binary_op_rsub<float>::operator()(&local_21,&local_3b0,pfVar2);
              pfVar2 = Mat::operator[](local_20,local_3b4);
              *pfVar2 = fVar4;
            }
            return 0;
          }
          return -100;
        }
        if (in_RSI->dims == 1) {
          Mat::create(in_stack_fffffffffffffb00,in_stack_fffffffffffffafc,
                      (size_t)in_stack_fffffffffffffaf0);
          bVar1 = Mat::empty(in_stack_fffffffffffffaf0);
          if (!bVar1) {
            pfVar2 = Mat::operator[](local_10,0);
            local_3b8 = *pfVar2;
            for (local_3bc = 0; local_3bc < local_44; local_3bc = local_3bc + 1) {
              pfVar2 = Mat::operator[](local_18,local_3bc);
              fVar4 = binary_op_rsub<float>::operator()(&local_21,&local_3b8,pfVar2);
              pfVar2 = Mat::operator[](local_20,local_3bc);
              *pfVar2 = fVar4;
            }
            return 0;
          }
          return -100;
        }
      }
      if (in_RSI->dims == 3) {
        Mat::create((Mat *)CONCAT44(in_stack_fffffffffffffb14,in_stack_fffffffffffffb10),_w,_h,_c,
                    CONCAT44(in_stack_fffffffffffffafc,in_stack_fffffffffffffaf8));
        bVar1 = Mat::empty(in_stack_fffffffffffffaf0);
        if (!bVar1) {
          for (local_3c0 = 0; local_3c0 < local_40; local_3c0 = local_3c0 + 1) {
            pfVar2 = Mat::operator[](local_10,local_3c0);
            local_3c4 = *pfVar2;
            Mat::channel((Mat *)CONCAT44(in_stack_fffffffffffffafc,in_stack_fffffffffffffaf8),
                         (int)((ulong)in_stack_fffffffffffffaf0 >> 0x20));
            pfVar2 = Mat::operator_cast_to_float_(&local_400);
            Mat::~Mat((Mat *)0x13b483);
            local_3d0 = pfVar2;
            Mat::channel((Mat *)CONCAT44(in_stack_fffffffffffffafc,in_stack_fffffffffffffaf8),
                         (int)((ulong)in_stack_fffffffffffffaf0 >> 0x20));
            pfVar2 = Mat::operator_cast_to_float_(&local_438);
            Mat::~Mat((Mat *)0x13b4cb);
            local_408 = pfVar2;
            for (local_43c = 0; local_43c < local_44; local_43c = local_43c + 1) {
              fVar4 = binary_op_rsub<float>::operator()(&local_21,&local_3c4,local_3d0 + local_43c);
              local_408[local_43c] = fVar4;
            }
          }
          return 0;
        }
        return -100;
      }
      if (in_RSI->dims == 2) {
        Mat::create(in_stack_fffffffffffffb00,in_stack_fffffffffffffafc,in_stack_fffffffffffffaf8,
                    (size_t)in_stack_fffffffffffffaf0);
        bVar1 = Mat::empty(in_stack_fffffffffffffaf0);
        if (!bVar1) {
          local_448 = Mat::operator_cast_to_float_(local_18);
          local_450 = Mat::operator_cast_to_float_(local_20);
          for (local_454 = 0; local_454 < local_3c; local_454 = local_454 + 1) {
            pfVar2 = Mat::operator[](local_10,local_454);
            local_458 = *pfVar2;
            for (local_45c = 0; local_45c < local_38; local_45c = local_45c + 1) {
              fVar4 = binary_op_rsub<float>::operator()(&local_21,&local_458,local_448 + local_45c);
              local_450[local_45c] = fVar4;
            }
            local_448 = local_448 + local_38;
            local_450 = local_450 + local_38;
          }
          return 0;
        }
        return -100;
      }
      if (in_RSI->dims == 1) {
        Mat::create(in_stack_fffffffffffffb00,in_stack_fffffffffffffafc,
                    (size_t)in_stack_fffffffffffffaf0);
        bVar1 = Mat::empty(in_stack_fffffffffffffaf0);
        if (bVar1) {
          return -100;
        }
        if (local_18->w == 1) {
          pfVar2 = Mat::operator[](local_18,0);
          local_460 = *pfVar2;
          for (local_464 = 0; local_464 < local_34; local_464 = local_464 + 1) {
            pfVar2 = Mat::operator[](local_10,local_464);
            fVar4 = binary_op_rsub<float>::operator()(&local_21,pfVar2,&local_460);
            pfVar2 = Mat::operator[](local_20,local_464);
            *pfVar2 = fVar4;
          }
          return 0;
        }
        for (local_468 = 0; local_468 < local_34; local_468 = local_468 + 1) {
          pfVar2 = Mat::operator[](local_10,local_468);
          pfVar3 = Mat::operator[](local_18,local_468);
          fVar4 = binary_op_rsub<float>::operator()(&local_21,pfVar2,pfVar3);
          pfVar2 = Mat::operator[](local_20,local_468);
          *pfVar2 = fVar4;
        }
      }
    }
  }
  return 0;
}

Assistant:

static int binary_op(const Mat& a, const Mat& b, Mat& c)
{
    Op op;

    int w = a.w;
    int h = a.h;
    int channels = a.c;
    int size = w * h;

    int w1 = b.w;
    int h1 = b.h;
    int channels1 = b.c;
    int size1 = w1 * h1;

    if (a.dims == 3)
    {
        c.create(w, h, channels);
        if (c.empty())
            return -100;

        if (b.dims == 3)
        {
            #pragma omp parallel for
            for (int q=0; q<channels; q++)
            {
                const float* ptr = a.channel(q);
                const float* ptr1 = b.channel(q);
                float* outptr = c.channel(q);

                for (int i=0; i<size; i++)
                {
                    outptr[i] = op(ptr[i], ptr1[i]);
                }
            }

            return 0;
        }

        if (b.dims == 2)
        {
            #pragma omp parallel for
            for (int q=0; q<channels; q++)
            {
                const float* ptr = a.channel(q);
                const float* ptr1 = (const float*)b + h * q;
                float* outptr = c.channel(q);

                for (int y=0; y<h; y++)
                {
                    const float b0 = ptr1[y];
                    for (int x=0; x<w; x++)
                    {
                        outptr[x] = op(ptr[x], b0);
                    }

                    ptr += w;
                    outptr += w;
                }
            }

            return 0;
        }

        if (b.dims == 1)
        {
            if (b.w == 1)
            {
                const float b0 = b[0];
                #pragma omp parallel for
                for (int q=0; q<channels; q++)
                {
                    const float* ptr = a.channel(q);
                    float* outptr = c.channel(q);

                    for (int i=0; i<size; i++)
                    {
                        outptr[i] = op(ptr[i], b0);
                    }
                }

                return 0;
            }

            #pragma omp parallel for
            for (int q=0; q<channels; q++)
            {
                const float* ptr = a.channel(q);
                const float b0 = b[q];
                float* outptr = c.channel(q);

                for (int i=0; i<size; i++)
                {
                    outptr[i] = op(ptr[i], b0);
                }
            }

            return 0;
        }
    }
    else if (a.dims == 2)
    {
        if (b.dims == 3)
        {
            c.create(w1, h1, channels1);
            if (c.empty())
                return -100;

            #pragma omp parallel for
            for (int q=0; q<channels1; q++)
            {
                const float* ptr = (const float*)a + h1 * q;
                const float* ptr1 = b.channel(q);
                float* outptr = c.channel(q);

                for (int y=0; y<h1; y++)
                {
                    const float a0 = ptr[y];
                    for (int x=0; x<w1; x++)
                    {
                        outptr[x] = op(a0, ptr1[x]);
                    }

                    ptr1 += w1;
                    outptr += w1;
                }
            }

            return 0;
        }

        c.create(w, h);
        if (c.empty())
            return -100;

        if (b.dims == 2)
        {
            for (int i=0; i<size; i++)
            {
                c[i] = op(a[i], b[i]);
            }

            return 0;
        }

        if (b.dims == 1)
        {
            c.create(w, h);
            if (c.empty())
                return -100;

            if (b.w == 1)
            {
                const float b0 = b[0];
                for (int i=0; i<size; i++)
                {
                    c[i] = op(a[i], b0);
                }

                return 0;
            }

            const float* ptr = a;
            float* outptr = c;

            for (int y=0; y<h; y++)
            {
                const float b0 = b[y];
                for (int x=0; x<w; x++)
                {
                    outptr[x] = op(ptr[x], b0);
                }

                ptr += w;
                outptr += w;
            }

            return 0;
        }
    }
    else if (a.dims == 1)
    {
        if (a.w == 1)
        {
            if (b.dims == 3)
            {
                c.create(w1, h1, channels1);
                if (c.empty())
                    return -100;

                const float a0 = a[0];
                #pragma omp parallel for
                for (int q=0; q<channels1; q++)
                {
                    const float* ptr1 = b.channel(q);
                    float* outptr = c.channel(q);

                    for (int i=0; i<size1; i++)
                    {
                        outptr[i] = op(a0, ptr1[i]);
                    }
                }

                return 0;
            }

            if (b.dims == 2)
            {
                c.create(w1, h1);
                if (c.empty())
                    return -100;

                const float a0 = a[0];
                for (int i=0; i<size1; i++)
                {
                    c[i] = op(a0, b[i]);
                }

                return 0;
            }

            if (b.dims == 1)
            {
                c.create(w1);
                if (c.empty())
                    return -100;

                const float a0 = a[0];
                for (int i=0; i<size1; i++)
                {
                    c[i] = op(a0, b[i]);
                }

                return 0;
            }
        }

        if (b.dims == 3)
        {
            c.create(w1, h1, channels1);
            if (c.empty())
                return -100;

            #pragma omp parallel for
            for (int q=0; q<channels1; q++)
            {
                const float a0 = a[q];
                const float* ptr1 = b.channel(q);
                float* outptr = c.channel(q);

                for (int i=0; i<size1; i++)
                {
                    outptr[i] = op(a0, ptr1[i]);
                }
            }

            return 0;
        }

        if (b.dims == 2)
        {
            c.create(w1, h1);
            if (c.empty())
                return -100;

            const float* ptr1 = b;
            float* outptr = c;

            for (int y=0; y<h1; y++)
            {
                const float a0 = a[y];
                for (int x=0; x<w1; x++)
                {
                    outptr[x] = op(a0, ptr1[x]);
                }

                ptr1 += w1;
                outptr += w1;
            }

            return 0;
        }

        if (b.dims == 1)
        {
            c.create(w);
            if (c.empty())
                return -100;

            if (b.w == 1)
            {
                const float b0 = b[0];
                for (int i=0; i<size; i++)
                {
                    c[i] = op(a[i], b0);
                }

                return 0;
            }

            for (int i=0; i<size; i++)
            {
                c[i] = op(a[i], b[i]);
            }
        }
    }

    return 0;
}